

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeGeneric
                   (uint16_t abssrc,uint16_t tolSig,float errTol,float srcFloat,int doprint)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  int in_EDX;
  uint16_t in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar10;
  float in_XMM1_Da;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint16_t smallest;
  uint16_t alt;
  uint16_t mask3;
  uint16_t extrabit;
  uint16_t srcMaskedVal;
  uint16_t mask2;
  uint16_t mask;
  uint16_t lowermask;
  uint16_t npow2;
  uint16_t tsigshift;
  float local_34;
  int local_2c;
  ushort local_24;
  
  iVar8 = countLeadingZeros(in_SI);
  uVar1 = 0x20 - (short)iVar8;
  uVar9 = 1 << ((byte)uVar1 & 0x1f);
  uVar2 = (ushort)uVar9;
  uVar3 = uVar2 - 1 ^ 0xffff;
  uVar4 = uVar3 ^ uVar2;
  uVar5 = in_DI & uVar2 - 1;
  uVar6 = (ushort)(uVar5 < in_SI);
  uVar7 = uVar4 ^ (uVar2 * 2 * uVar6 |
                  (short)((int)(uVar9 & 0xffff) >> 1) * (ushort)((uVar6 != 0 ^ 0xffU) & 1));
  if (in_EDX != 0) {
    printf("  npow2  0x%04X %016b %d\n",(ulong)uVar2,(ulong)uVar2,(ulong)uVar1);
    printf("  srcMV  0x%04X %016b %d\n",(ulong)uVar5,(ulong)uVar5,(ulong)uVar5);
    printf("  mask   0x%04X %016b\n",(ulong)uVar3,(ulong)uVar3);
    printf("  mask2  0x%04X %016b\n",(ulong)uVar4,(ulong)uVar4);
    printf("  mask3  0x%04X %016b\n",(ulong)uVar7,(ulong)uVar7);
  }
  local_2c = countSetBits(in_DI);
  if (uVar6 == 0) {
    if ((in_DI & uVar2) == 0) {
      if (in_EDX != 0) {
        printf("  test0  0x%04X %016b\n",(ulong)(in_DI & uVar4),(ulong)(in_DI & uVar4));
        printf("  test1  0x%04X %016b\n",(ulong)(in_DI & uVar3),(ulong)(in_DI & uVar3));
        printf("  test2  0x%04X %016b\n",(ulong)(in_DI & uVar7),(ulong)(in_DI & uVar7));
      }
      uVar4 = in_DI & uVar4;
      iVar8 = countSetBits(uVar4);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar4);
        fVar10 = in_XMM1_Da - fVar10;
        local_34 = in_XMM0_Da;
        local_24 = in_DI;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar4, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar4);
        }
      }
      else {
        local_34 = in_XMM0_Da;
        local_24 = in_DI;
        if (iVar8 == local_2c) {
          fVar10 = imath_half_to_float(uVar4);
          local_34 = in_XMM0_Da;
          local_24 = in_DI;
          if (in_XMM1_Da - fVar10 < in_XMM0_Da) {
            local_34 = in_XMM1_Da - fVar10;
            local_2c = iVar8;
            local_24 = uVar4;
          }
        }
      }
      uVar1 = in_DI & uVar3;
      iVar8 = countSetBits(uVar1);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar1);
        fVar10 = in_XMM1_Da - fVar10;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar1, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar1);
        }
      }
      else if (iVar8 == local_2c) {
        fVar10 = imath_half_to_float(uVar1);
        if (in_XMM1_Da - fVar10 < local_34) {
          local_34 = in_XMM1_Da - fVar10;
          local_2c = iVar8;
          local_24 = uVar1;
        }
      }
      uVar7 = in_DI & uVar7;
      iVar8 = countSetBits(uVar7);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar7);
        fVar10 = in_XMM1_Da - fVar10;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar7, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar7);
        }
      }
      else if (iVar8 == local_2c) {
        fVar10 = imath_half_to_float(uVar7);
        if (in_XMM1_Da - fVar10 < local_34) {
          local_34 = in_XMM1_Da - fVar10;
          local_2c = iVar8;
          local_24 = uVar7;
        }
      }
    }
    else {
      if (in_EDX != 0) {
        printf("  t_np0  0x%04X %016b\n",(ulong)(in_DI & uVar4),(ulong)(in_DI & uVar4));
        printf("  t_np1  0x%04X %016b\n",(ulong)(in_DI & uVar7),(ulong)(in_DI & uVar7));
        printf("  t_np2  0x%04X %016b\n",(ulong)(in_DI & uVar3),(ulong)(in_DI & uVar3));
      }
      uVar4 = in_DI & uVar4;
      iVar8 = countSetBits(uVar4);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar4);
        fVar10 = in_XMM1_Da - fVar10;
        local_34 = in_XMM0_Da;
        local_24 = in_DI;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar4, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar4);
        }
      }
      else {
        local_34 = in_XMM0_Da;
        local_24 = in_DI;
        if (iVar8 == local_2c) {
          fVar10 = imath_half_to_float(uVar4);
          local_34 = in_XMM0_Da;
          local_24 = in_DI;
          if (in_XMM1_Da - fVar10 < in_XMM0_Da) {
            local_34 = in_XMM1_Da - fVar10;
            local_2c = iVar8;
            local_24 = uVar4;
          }
        }
      }
      uVar7 = in_DI & uVar7;
      iVar8 = countSetBits(uVar7);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar7);
        fVar10 = in_XMM1_Da - fVar10;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar7, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar7);
        }
      }
      else if (iVar8 == local_2c) {
        fVar10 = imath_half_to_float(uVar7);
        if (in_XMM1_Da - fVar10 < local_34) {
          local_34 = in_XMM1_Da - fVar10;
          local_2c = iVar8;
          local_24 = uVar7;
        }
      }
      uVar1 = in_DI & uVar3;
      iVar8 = countSetBits(uVar1);
      if (iVar8 < local_2c) {
        fVar10 = imath_half_to_float(uVar1);
        fVar10 = in_XMM1_Da - fVar10;
        if ((fVar10 < in_XMM0_Da) &&
           (local_34 = fVar10, local_2c = iVar8, local_24 = uVar1, in_EDX != 0)) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar1);
        }
      }
      else if (iVar8 == local_2c) {
        fVar10 = imath_half_to_float(uVar1);
        if (in_XMM1_Da - fVar10 < local_34) {
          local_34 = in_XMM1_Da - fVar10;
          local_2c = iVar8;
          local_24 = uVar1;
        }
      }
    }
  }
  else {
    if (in_EDX != 0) {
      printf("  t_eb0  0x%04X %016b\n",(ulong)(in_DI & uVar7),(ulong)(in_DI & uVar7));
      printf("  t_eb1  0x%04X %016b\n",(ulong)(in_DI & uVar4),(ulong)(in_DI & uVar4));
      printf("  t_eb2  0x%04X %016b\n",(ulong)(in_DI & uVar3),(ulong)(in_DI & uVar3));
    }
    uVar7 = in_DI & uVar7;
    iVar8 = countSetBits(uVar7);
    if (iVar8 < local_2c) {
      fVar10 = imath_half_to_float(uVar7);
      fVar10 = in_XMM1_Da - fVar10;
      local_34 = in_XMM0_Da;
      local_24 = in_DI;
      if ((fVar10 < in_XMM0_Da) &&
         (local_34 = fVar10, local_2c = iVar8, local_24 = uVar7, in_EDX != 0)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar7);
      }
    }
    else {
      local_34 = in_XMM0_Da;
      local_24 = in_DI;
      if (iVar8 == local_2c) {
        fVar10 = imath_half_to_float(uVar7);
        local_34 = in_XMM0_Da;
        local_24 = in_DI;
        if (in_XMM1_Da - fVar10 < in_XMM0_Da) {
          local_34 = in_XMM1_Da - fVar10;
          local_2c = iVar8;
          local_24 = uVar7;
        }
      }
    }
    uVar4 = in_DI & uVar4;
    iVar8 = countSetBits(uVar4);
    if (iVar8 < local_2c) {
      fVar10 = imath_half_to_float(uVar4);
      fVar10 = in_XMM1_Da - fVar10;
      if ((fVar10 < in_XMM0_Da) &&
         (local_34 = fVar10, local_2c = iVar8, local_24 = uVar4, in_EDX != 0)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar4);
      }
    }
    else if (iVar8 == local_2c) {
      fVar10 = imath_half_to_float(uVar4);
      if (in_XMM1_Da - fVar10 < local_34) {
        local_34 = in_XMM1_Da - fVar10;
        local_2c = iVar8;
        local_24 = uVar4;
      }
    }
    uVar1 = in_DI & uVar3;
    iVar8 = countSetBits(uVar1);
    if (iVar8 < local_2c) {
      fVar10 = imath_half_to_float(uVar1);
      fVar10 = in_XMM1_Da - fVar10;
      if ((fVar10 < in_XMM0_Da) &&
         (local_34 = fVar10, local_2c = iVar8, local_24 = uVar1, in_EDX != 0)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar10,(ulong)uVar1);
      }
    }
    else if (iVar8 == local_2c) {
      fVar10 = imath_half_to_float(uVar1);
      if (in_XMM1_Da - fVar10 < local_34) {
        local_34 = in_XMM1_Da - fVar10;
        local_2c = iVar8;
        local_24 = uVar1;
      }
    }
  }
  if (in_EDX != 0) {
    printf("  test4  0x%04X %016b\n",(ulong)((uint)in_DI + (uVar9 & 0xffff) & (uint)uVar3),
           (ulong)((uint)in_DI + (uVar9 & 0xffff) & (uint)uVar3));
  }
  uVar3 = in_DI + uVar2 & uVar3;
  iVar8 = countSetBits(uVar3);
  if (iVar8 < local_2c) {
    fVar10 = imath_half_to_float(uVar3);
    if ((fVar10 - in_XMM1_Da < in_XMM0_Da) && (local_24 = uVar3, in_EDX != 0)) {
      printf("  lrgtst 0x%04X delta %g\n",(double)(fVar10 - in_XMM1_Da),(ulong)uVar3);
    }
  }
  else if ((iVar8 == local_2c) &&
          (fVar10 = imath_half_to_float(uVar3), fVar10 - in_XMM1_Da < local_34)) {
    local_24 = uVar3;
  }
  return local_24;
}

Assistant:

static uint16_t handleQuantizeGeneric (
    uint16_t abssrc, uint16_t tolSig, float errTol, float srcFloat, int doprint)
{
    // classic would do clz(significand - 1) but here we are trying to
    // construct a mask, so want to ensure for an power of 2, we
    // actually get the next (i.e. 2 returns 4)
    const uint16_t tsigshift = (32 - countLeadingZeros (tolSig));
    const uint16_t npow2 = (1 << tsigshift);
    const uint16_t lowermask = npow2 - 1;
    const uint16_t mask = ~lowermask;
    const uint16_t mask2 = mask ^ npow2;
    const uint16_t srcMaskedVal = abssrc & lowermask;
    const uint16_t extrabit = (tolSig > srcMaskedVal);

    const uint16_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    if (doprint)
    {
        printf ("  npow2  0x%04X %016b %d\n", npow2, npow2, tsigshift);
        printf ("  srcMV  0x%04X %016b %d\n", srcMaskedVal, srcMaskedVal, srcMaskedVal);
        printf ("  mask   0x%04X %016b\n", mask, mask);
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  mask3  0x%04X %016b\n", mask3, mask3);
    }

    uint16_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    if (extrabit)
    {
        if (doprint)
        {
            printf ("  t_eb0  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  t_eb1  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  t_eb2  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask2);

        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask);
    }
    else if ((abssrc & npow2) != 0)
    {
        if (doprint)
        {
            printf ("  t_np0  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  t_np1  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  t_np2  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask2);
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);

        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask);
    }
    else
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  test1  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
            printf ("  test2  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask2);

        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask);
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
    }
    if (doprint)
    {
        printf ("  test4  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
    }
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);

    return smallest;
}